

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O2

bool __thiscall ipx::Iterate::optimal(Iterate *this)

{
  double dVar1;
  double dVar2;
  
  Evaluate(this);
  dVar1 = pobjective_after_postproc(this);
  dVar2 = dobjective_after_postproc(this);
  return ABS(dVar1 - dVar2) <= (ABS((dVar1 + dVar2) * 0.5) + 1.0) * this->optimality_tol_;
}

Assistant:

bool Iterate::optimal() const {
    Evaluate();
    double pobj = pobjective_after_postproc();
    double dobj = dobjective_after_postproc();
    double obj = 0.5 * (pobj + dobj);
    double gap = pobj - dobj;
    const double abs_gap = std::abs(gap);
    const double obj_measure = 1.0+std::abs(obj);
    const bool is_optimal = abs_gap <= optimality_tol_ * obj_measure;
    if (kTerminationLogging) {
      const double rel_gap = abs_gap / obj_measure; 
      printf("Iterate::optimal     abs_gap = %11.4g;"
	     " obj_measure    = %11.4g; rel_gap       = %11.4g;"
	     "  optimality_tol = %11.4g:   optimal       = %d\n",
	     abs_gap, obj_measure, rel_gap, optimality_tol_, is_optimal);
    }
    return is_optimal;
}